

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int vrna_params_load(char *fname,uint options)

{
  char **file_content_00;
  char *name_00;
  int local_34;
  char **ppcStack_30;
  int ret;
  char **ptr;
  char **file_content;
  char *name;
  uint options_local;
  char *fname_local;
  
  local_34 = 0;
  file_content_00 = file2array(fname);
  if (file_content_00 != (char **)0x0) {
    name_00 = vrna_basename(fname);
    local_34 = set_parameters_from_string(file_content_00,name_00);
    free(name_00);
    for (ppcStack_30 = file_content_00; *ppcStack_30 != (char *)0x0; ppcStack_30 = ppcStack_30 + 1)
    {
      free(*ppcStack_30);
    }
    free(file_content_00);
  }
  return local_34;
}

Assistant:

PUBLIC int
vrna_params_load(const char   fname[],
                 unsigned int options)
{
  char  *name, **file_content, **ptr;
  int   ret;

  ret           = 0;
  file_content  = file2array(fname);

  if (file_content) {
    name = vrna_basename(fname);

    ret = set_parameters_from_string(file_content,
                                     (const char *)name);

    free(name);
    for (ptr = file_content; *ptr != NULL; ptr++)
      free(*ptr);

    free(file_content);
  }

  return ret;
}